

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O2

void glcts::TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect
               (_test_result *test_result,GLenum glMaxTessGenLevelToken)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  int iVar5;
  deUint32 err;
  float *found_vertex1_x;
  undefined4 extraout_var;
  pointer ppVar6;
  MessageBuilder *pMVar7;
  TestError *this;
  long lVar8;
  uint n_vertex;
  uint uVar9;
  float fVar10;
  float fVar11;
  float outer_tess_levels1_clamped_rounded;
  GLint gl_max_tess_gen_level_value;
  _line_segments found_line_segments;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [376];
  
  found_line_segments.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  found_line_segments.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  found_line_segments.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = (*((test_result->parent->parent->super_TestCaseBase).m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl_max_tess_gen_level_value = 0;
  outer_tess_levels1_clamped_rounded = 0.0;
  if (test_result->n_vertices != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar5) + 0x868))
              (glMaxTessGenLevelToken,&gl_max_tess_gen_level_value);
    err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0xfa);
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (test_result->parent->vertex_spacing_mode,test_result->parent->outer_tess_levels[1],
               gl_max_tess_gen_level_value,(float *)0x0,&outer_tess_levels1_clamped_rounded);
    lVar8 = (long)outer_tess_levels1_clamped_rounded;
    for (uVar9 = 0; uVar9 < test_result->n_vertices; uVar9 = uVar9 + 2) {
      pfVar4 = (test_result->rendered_data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar2 = pfVar4[uVar9 * 3];
      fVar3 = pfVar4[uVar9 * 3 + 3];
      for (ppVar6 = found_line_segments.
                    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar6 != found_line_segments.
                    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
        fVar10 = ppVar6->first - fVar2;
        fVar11 = -fVar10;
        if (-fVar10 <= fVar10) {
          fVar11 = fVar10;
        }
        if (fVar11 < 1e-05) {
          fVar10 = ppVar6->second - fVar3;
          fVar11 = -fVar10;
          if (-fVar10 <= fVar10) {
            fVar11 = fVar10;
          }
          if (fVar11 < 1e-05) goto LAB_00d0ca3d;
        }
      }
      local_1b0._4_4_ = fVar3;
      local_1b0._0_4_ = fVar2;
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      emplace_back<std::pair<float,float>>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 &found_line_segments,(pair<float,_float> *)local_1b0);
LAB_00d0ca3d:
    }
    if ((int)lVar8 !=
        (int)((ulong)((long)found_line_segments.
                            super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)found_line_segments.
                           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      local_1b0 = (undefined1  [8])
                  ((test_result->parent->parent->super_TestCaseBase).super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Tessellator generated an invalid amount of unique line segments:");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8," instead of the expected amount:");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator<<((ostream *)local_1a8,
                      " for the following inner tessellation level configuration:");
      std::operator<<((ostream *)local_1a8," (");
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,test_result->parent->inner_tess_levels);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->inner_tess_levels + 1);
      poVar1 = &pMVar7->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " and the following outer tesellation level configuration:");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," (");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 1);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 2);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 3);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      " and the following vertex spacing mode: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&test_result->parent->vertex_spacing_mode);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid amount of unique line segments generated by tessellator",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                 ,0x136);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::_Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
  ~_Vector_base(&found_line_segments.
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
               );
  return;
}

Assistant:

void TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect(_test_result&		test_result,
																		  const glw::GLenum glMaxTessGenLevelToken)
{
	typedef float _line_segment_x;
	typedef std::pair<_line_segment_x, _line_segment_x> _line_segment;
	typedef std::vector<_line_segment> _line_segments;
	typedef _line_segments::iterator   _line_segments_iterator;

	glcts::Context&		  context = test_result.parent->parent->getContext();
	const float			  epsilon = 1e-5f;
	_line_segments		  found_line_segments;
	const glw::Functions& gl								   = context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value		   = 0;
	float				  outer_tess_levels1_clamped_rounded   = 0.0f;
	unsigned int		  n_line_segments_per_isoline_expected = 0;
	unsigned int		  n_unique_line_segments_found		   = 0;

	if (test_result.n_vertices != 0)
	{
		/* Calculate how many isolines we're expecting */
		gl.getIntegerv(glMaxTessGenLevelToken, &gl_max_tess_gen_level_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			test_result.parent->vertex_spacing_mode, test_result.parent->outer_tess_levels[1],
			gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outer_tess_levels1_clamped_rounded);

		n_line_segments_per_isoline_expected = (unsigned int)outer_tess_levels1_clamped_rounded;

		/* Count unique line segments found in all the line segments making up the result data set.  */
		for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices;
			 n_vertex += 2 /* vertices per line segment */)
		{
			bool		 was_line_segment_found = false;
			const float* vertex1				= (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
			float		 vertex1_x				= vertex1[0];
			const float* vertex2				= (&test_result.rendered_data[0]) + (n_vertex + 1) * 3; /* components */
			float		 vertex2_x				= vertex2[0];

			for (_line_segments_iterator found_line_segments_iterator = found_line_segments.begin();
				 found_line_segments_iterator != found_line_segments.end(); found_line_segments_iterator++)
			{
				float& found_vertex1_x = found_line_segments_iterator->first;
				float& found_vertex2_x = found_line_segments_iterator->second;

				if (de::abs(found_vertex1_x - vertex1_x) < epsilon && de::abs(found_vertex2_x - vertex2_x) < epsilon)
				{
					was_line_segment_found = true;

					break;
				}
			} /* for (all found Ys) */

			if (!was_line_segment_found)
			{
				found_line_segments.push_back(_line_segment(vertex1_x, vertex2_x));
			}
		} /* for (all vertices) */

		/* Compare the values */
		n_unique_line_segments_found = (unsigned int)found_line_segments.size();

		if (n_unique_line_segments_found != n_line_segments_per_isoline_expected)
		{
			tcu::TestContext& test = test_result.parent->parent->getTestContext();

			test.getLog() << tcu::TestLog::Message << "Tessellator generated an invalid amount of unique line segments:"
						  << n_unique_line_segments_found
						  << " instead of the expected amount:" << n_line_segments_per_isoline_expected
						  << " for the following inner tessellation level configuration:"
						  << " (" << test_result.parent->inner_tess_levels[0] << ", "
						  << test_result.parent->inner_tess_levels[1] << ")"
						  << " and the following outer tesellation level configuration:"
						  << " (" << test_result.parent->outer_tess_levels[0] << ", "
						  << test_result.parent->outer_tess_levels[1] << ", "
						  << test_result.parent->outer_tess_levels[2] << ", "
						  << test_result.parent->outer_tess_levels[3] << ")"
						  << " and the following vertex spacing mode: " << test_result.parent->vertex_spacing_mode
						  << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid amount of unique line segments generated by tessellator");
		}
	} /* if (test_run.n_vertices != 0) */
}